

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *
findCluster(set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *__return_storage_ptr__,
           Mat *binary,int x,int y)

{
  mPoint local_9c [2];
  Mat local_88 [103];
  undefined1 local_21;
  int local_20;
  int local_1c;
  int y_local;
  int x_local;
  Mat *binary_local;
  set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *cluster;
  
  local_21 = 0;
  local_20 = y;
  local_1c = x;
  _y_local = binary;
  binary_local = (Mat *)__return_storage_ptr__;
  std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::set(__return_storage_ptr__);
  cv::Mat::Mat(local_88,binary);
  mPoint::mPoint(local_9c,local_1c,local_20);
  searchCluster(local_88,local_9c,__return_storage_ptr__);
  cv::Mat::~Mat(local_88);
  return __return_storage_ptr__;
}

Assistant:

std::set<mPoint> findCluster(cv::Mat binary, int x, int y) {
	std::set<mPoint> cluster;
	searchCluster(binary, mPoint(x, y), cluster);
	return cluster;
}